

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_plot(nk_context *ctx,nk_chart_type type,float *values,int count,int offset)

{
  float *pfVar1;
  float fVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  float min_value;
  float max_value;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x5eea,
                  "void nk_plot(struct nk_context *, enum nk_chart_type, const float *, int, int)");
  }
  if (values == (float *)0x0) {
    __assert_fail("values",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x5eeb,
                  "void nk_plot(struct nk_context *, enum nk_chart_type, const float *, int, int)");
  }
  if (count != 0) {
    pfVar1 = values + offset;
    min_value = *pfVar1;
    uVar4 = 0;
    uVar5 = 0;
    max_value = min_value;
    if (0 < count) {
      uVar5 = (ulong)(uint)count;
    }
    for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      fVar2 = pfVar1[uVar4];
      if (max_value <= fVar2) {
        max_value = fVar2;
      }
      if (min_value <= fVar2) {
        fVar2 = min_value;
      }
      min_value = fVar2;
    }
    iVar3 = nk_chart_begin(ctx,type,count,min_value,max_value);
    if (iVar3 != 0) {
      for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
        nk_chart_push(ctx,pfVar1[uVar4]);
      }
      nk_chart_end(ctx);
      return;
    }
  }
  return;
}

Assistant:

NK_API void
nk_plot(struct nk_context *ctx, enum nk_chart_type type, const float *values,
    int count, int offset)
{
    int i = 0;
    float min_value;
    float max_value;

    NK_ASSERT(ctx);
    NK_ASSERT(values);
    if (!ctx || !values || !count) return;

    min_value = values[offset];
    max_value = values[offset];
    for (i = 0; i < count; ++i) {
        min_value = NK_MIN(values[i + offset], min_value);
        max_value = NK_MAX(values[i + offset], max_value);
    }

    if (nk_chart_begin(ctx, type, count, min_value, max_value)) {
        for (i = 0; i < count; ++i)
            nk_chart_push(ctx, values[i + offset]);
        nk_chart_end(ctx);
    }
}